

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

int xmlXIncludeIncludeNode(xmlXIncludeCtxtPtr ctxt,xmlXIncludeRefPtr ref)

{
  xmlNodePtr node;
  _xmlNode *p_Var1;
  xmlNodePtr elem;
  xmlNodePtr next;
  xmlNodePtr child;
  _xmlNode *p_Stack_40;
  int nb_elem;
  xmlNodePtr tmp;
  xmlNodePtr list;
  xmlNodePtr end;
  xmlNodePtr cur;
  xmlXIncludeRefPtr ref_local;
  xmlXIncludeCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlXIncludeCtxtPtr)0x0) || (ref == (xmlXIncludeRefPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    node = ref->elem;
    if ((node == (xmlNodePtr)0x0) || (node->type == XML_NAMESPACE_DECL)) {
      ctxt_local._4_4_ = -1;
    }
    else {
      tmp = ref->inc;
      ref->inc = (xmlNodePtr)0x0;
      ref->emptyFb = 0;
      if ((node->parent != (_xmlNode *)0x0) && (node->parent->type != XML_ELEMENT_NODE)) {
        child._4_4_ = 0;
        for (p_Stack_40 = tmp; p_Stack_40 != (xmlNodePtr)0x0; p_Stack_40 = p_Stack_40->next) {
          if (p_Stack_40->type == XML_ELEMENT_NODE) {
            child._4_4_ = child._4_4_ + 1;
          }
        }
        if (1 < child._4_4_) {
          xmlXIncludeErr(ctxt,ref->elem,0x64b,
                         "XInclude error: would result in multiple root nodes\n",(xmlChar *)0x0);
          xmlFreeNodeList(tmp);
          return -1;
        }
      }
      if ((ctxt->parseFlags & 0x8000U) == 0) {
        if (ref->fallback != 0) {
          xmlUnsetProp(node,"href");
        }
        node->type = XML_XINCLUDE_START;
        next = node->children;
        while (next != (xmlNodePtr)0x0) {
          p_Var1 = next->next;
          xmlUnlinkNode(next);
          xmlFreeNode(next);
          next = p_Var1;
        }
        elem = xmlNewDocNode(node->doc,node->ns,node->name,(xmlChar *)0x0);
        if (elem == (xmlNodePtr)0x0) {
          xmlXIncludeErr(ctxt,ref->elem,0x649,"failed to build node\n",(xmlChar *)0x0);
          xmlFreeNodeList(tmp);
          return -1;
        }
        elem->type = XML_XINCLUDE_END;
        xmlAddNextSibling(node,elem);
        while (tmp != (xmlNodePtr)0x0) {
          p_Var1 = tmp->next;
          xmlAddPrevSibling(elem,tmp);
          tmp = p_Var1;
        }
      }
      else {
        while (tmp != (xmlNodePtr)0x0) {
          p_Var1 = tmp->next;
          xmlAddPrevSibling(node,tmp);
          tmp = p_Var1;
        }
        xmlUnlinkNode(node);
        xmlFreeNode(node);
      }
      ctxt_local._4_4_ = 0;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlXIncludeIncludeNode(xmlXIncludeCtxtPtr ctxt, xmlXIncludeRefPtr ref) {
    xmlNodePtr cur, end, list, tmp;

    if ((ctxt == NULL) || (ref == NULL))
	return(-1);
    cur = ref->elem;
    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL))
	return(-1);

    list = ref->inc;
    ref->inc = NULL;
    ref->emptyFb = 0;

    /*
     * Check against the risk of generating a multi-rooted document
     */
    if ((cur->parent != NULL) &&
	(cur->parent->type != XML_ELEMENT_NODE)) {
	int nb_elem = 0;

	tmp = list;
	while (tmp != NULL) {
	    if (tmp->type == XML_ELEMENT_NODE)
		nb_elem++;
	    tmp = tmp->next;
	}
	if (nb_elem > 1) {
	    xmlXIncludeErr(ctxt, ref->elem, XML_XINCLUDE_MULTIPLE_ROOT,
		       "XInclude error: would result in multiple root nodes\n",
			   NULL);
            xmlFreeNodeList(list);
	    return(-1);
	}
    }

    if (ctxt->parseFlags & XML_PARSE_NOXINCNODE) {
	/*
	 * Add the list of nodes
	 */
	while (list != NULL) {
	    end = list;
	    list = list->next;

	    xmlAddPrevSibling(cur, end);
	}
        /*
         * FIXME: xmlUnlinkNode doesn't coalesce text nodes.
         */
	xmlUnlinkNode(cur);
	xmlFreeNode(cur);
    } else {
        xmlNodePtr child, next;

	/*
	 * Change the current node as an XInclude start one, and add an
	 * XInclude end one
	 */
        if (ref->fallback)
            xmlUnsetProp(cur, BAD_CAST "href");
	cur->type = XML_XINCLUDE_START;
        /* Remove fallback children */
        for (child = cur->children; child != NULL; child = next) {
            next = child->next;
            xmlUnlinkNode(child);
            xmlFreeNode(child);
        }
	end = xmlNewDocNode(cur->doc, cur->ns, cur->name, NULL);
	if (end == NULL) {
	    xmlXIncludeErr(ctxt, ref->elem, XML_XINCLUDE_BUILD_FAILED,
			   "failed to build node\n", NULL);
            xmlFreeNodeList(list);
	    return(-1);
	}
	end->type = XML_XINCLUDE_END;
	xmlAddNextSibling(cur, end);

	/*
	 * Add the list of nodes
	 */
	while (list != NULL) {
	    cur = list;
	    list = list->next;

	    xmlAddPrevSibling(end, cur);
	}
    }


    return(0);
}